

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.tweetnacl.c
# Opt level: O3

void mul(int64_t *o,int64_t *a,int64_t *b)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  size_t i_1;
  long lVar5;
  int64_t *piVar6;
  int64_t *piVar7;
  size_t i;
  long lVar8;
  byte bVar9;
  undefined1 auVar10 [16];
  int64_t t [31];
  int64_t local_128 [16];
  long alStack_a8 [16];
  uint uVar11;
  
  bVar9 = 0;
  piVar7 = local_128;
  lVar8 = 0;
  memset(local_128,0,0xf8);
  do {
    uVar1 = a[lVar8];
    uVar11 = (uint)(uVar1 >> 0x20);
    auVar10._8_4_ = (int)uVar1;
    auVar10._0_8_ = uVar1;
    auVar10._12_4_ = uVar11;
    lVar5 = 0;
    do {
      uVar3 = b[lVar5];
      uVar4 = (b + lVar5)[1];
      lVar2 = ((long *)((long)piVar7 + lVar5 * 8))[1];
      *(long *)((long)piVar7 + lVar5 * 8) =
           *(long *)((long)piVar7 + lVar5 * 8) + (uVar3 & 0xffffffff) * (uVar1 & 0xffffffff) +
           ((uVar3 >> 0x20) * (uVar1 & 0xffffffff) + (uVar3 & 0xffffffff) * (ulong)uVar11 << 0x20);
      ((long *)((long)piVar7 + lVar5 * 8))[1] =
           lVar2 + (uVar4 & 0xffffffff) * (uVar1 & 0xffffffff) +
           ((uVar4 >> 0x20) * (uVar1 & 0xffffffff) + (uVar4 & 0xffffffff) * (auVar10._8_8_ >> 0x20)
           << 0x20);
      lVar5 = lVar5 + 2;
    } while (lVar5 != 0x10);
    lVar8 = lVar8 + 1;
    piVar7 = (int64_t *)((long)piVar7 + 8);
  } while (lVar8 != 0x10);
  lVar8 = 0;
  do {
    local_128[lVar8] = local_128[lVar8] + alStack_a8[lVar8] * 0x26;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 0xf);
  piVar7 = local_128;
  piVar6 = o;
  for (lVar8 = 0x10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *piVar6 = *piVar7;
    piVar7 = piVar7 + (ulong)bVar9 * -2 + 1;
    piVar6 = piVar6 + (ulong)bVar9 * -2 + 1;
  }
  car25519(o);
  car25519(o);
  return;
}

Assistant:

static void mul(gf o, const gf a, const gf b)
{
  int64_t t[31];

  for (size_t i = 0; i < 31; i++)
    t[i] = 0;

  for (size_t i = 0; i < 16; i++)
    for (size_t j = 0; j < 16; j++)
      t[i + j] += a[i] * b[j];

  for (size_t i = 0; i < 15; i++)
    t[i] += 38 * t[i + 16];

  for (size_t i = 0; i < 16; i++)
    o[i] = t[i];

  car25519(o);
  car25519(o);
}